

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qchar.cpp
# Opt level: O0

bool QChar::isPrint(char32_t ucs4)

{
  Properties *pPVar1;
  char32_t in_EDI;
  int test;
  undefined1 local_1;
  
  if ((uint)in_EDI < 0x110000) {
    pPVar1 = QUnicodeTables::qGetProp(in_EDI);
    local_1 = (1 << ((byte)*(undefined8 *)pPVar1 & 0x1f) & 0x3e00U) == 0;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool QChar::isPrint(char32_t ucs4) noexcept
{
    if (ucs4 > LastValidCodePoint)
        return false;
    const int test = FLAG(Other_Control) |
                     FLAG(Other_Format) |
                     FLAG(Other_Surrogate) |
                     FLAG(Other_PrivateUse) |
                     FLAG(Other_NotAssigned);
    return !(FLAG(qGetProp(ucs4)->category) & test);
}